

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O0

int nn_cws_create(nn_ep *ep)

{
  int iVar1;
  nn_usock *tran;
  nn_ep *__s;
  size_t sVar2;
  char *pcVar3;
  char *__s_00;
  nn_sws *size;
  nn_usock *fn;
  void *pvVar4;
  undefined1 *puVar5;
  nn_worker *in_RDI;
  size_t sz;
  int msg_type;
  int reconnect_ivl_max;
  int reconnect_ivl;
  nn_cws *self;
  size_t ipv4onlylen;
  int ipv4only;
  size_t sslen;
  sockaddr_storage ss;
  size_t resourcelen;
  char *resource;
  char *slash;
  char *colon;
  size_t hostlen;
  char *hostname;
  char *semicolon;
  size_t addrlen;
  char *addr;
  int rc;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  nn_usock *self_00;
  size_t *in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffed0;
  nn_sws *__s_01;
  nn_sws *pnVar6;
  undefined8 in_stack_fffffffffffffed8;
  nn_ep *in_stack_fffffffffffffee0;
  nn_ep *name;
  nn_ep *self_01;
  char *in_stack_fffffffffffffee8;
  long lVar7;
  undefined1 local_10c;
  size_t *in_stack_ffffffffffffff28;
  sockaddr_storage *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  size_t in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int local_4;
  
  tran = (nn_usock *)nn_alloc_(0x1555f9);
  if (tran == (nn_usock *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
            ,0x97);
    fflush(_stderr);
    nn_err_abort();
  }
  tran->worker = in_RDI;
  tran[0xb].errnum = 0;
  nn_ep_tran_setup((nn_ep *)in_RDI,&nn_cws_ep_ops,tran);
  nn_ep_getopt(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (int)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  __s = (nn_ep *)nn_ep_getaddr((nn_ep *)in_RDI);
  sVar2 = strlen((char *)__s);
  pcVar3 = strchr((char *)__s,0x3b);
  name = __s;
  if (pcVar3 != (char *)0x0) {
    name = (nn_ep *)(pcVar3 + 1);
  }
  self_01 = name;
  __s_00 = strrchr((char *)__s,0x3a);
  if (__s_00 == (char *)0x0) {
    size = (nn_sws *)strchr((char *)__s,0x2f);
  }
  else {
    size = (nn_sws *)strchr(__s_00,0x2f);
  }
  __s_01 = size;
  if (size == (nn_sws *)0x0) {
    __s_01 = (nn_sws *)(((anon_union_32_2_f8a10162_for_u *)&__s->fsm)->ref + sVar2);
  }
  if (__s_00 == (char *)0x0) {
    fn = (nn_usock *)((long)__s_01 - (long)name);
  }
  else {
    fn = (nn_usock *)(__s_00 + -(long)name);
  }
  tran[0xb].asock = fn;
  pnVar6 = __s_01;
  if (__s_00 == (char *)0x0) {
    *(undefined4 *)&tran[0xb].event_error.item.next = 0x50;
  }
  else {
    iVar1 = nn_port_resolve(__s_00 + 1,(size_t)((long)__s_01 + (-1 - (long)__s_00)));
    if (iVar1 < 0) {
      nn_free((void *)0x1558e5);
      return -0x16;
    }
    *(int *)&tran[0xb].event_error.item.next = iVar1;
  }
  iVar1 = nn_dns_check_hostname((char *)name,(size_t)tran[0xb].asock);
  if ((iVar1 < 0) &&
     (iVar1 = nn_literal_resolve(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30,
                                 in_stack_ffffffffffffff28), iVar1 < 0)) {
    nn_free((void *)0x15596c);
    local_4 = -0x16;
  }
  else if ((pcVar3 == (char *)0x0) ||
          (iVar1 = nn_iface_resolve(in_stack_fffffffffffffee8,(size_t)self_01,
                                    (int)((ulong)size >> 0x20),(sockaddr_storage *)pnVar6,
                                    (size_t *)fn), -1 < iVar1)) {
    nn_chunkref_init((nn_chunkref *)self_01,(size_t)size);
    pvVar4 = nn_chunkref_data((nn_chunkref *)&tran[0xb].event_received.src);
    memcpy(pvVar4,name,(long)__s_01 - (long)name);
    pvVar4 = nn_chunkref_data((nn_chunkref *)&tran[0xb].event_received.src);
    *(undefined1 *)((long)pvVar4 + ((long)__s_01 - (long)name)) = 0;
    if (pcVar3 == (char *)0x0) {
      nn_chunkref_init((nn_chunkref *)self_01,(size_t)size);
      puVar5 = (undefined1 *)nn_chunkref_data((nn_chunkref *)&tran[0xb].event_error);
      *puVar5 = 0x2a;
    }
    else {
      nn_chunkref_init((nn_chunkref *)self_01,(size_t)size);
      pvVar4 = nn_chunkref_data((nn_chunkref *)&tran[0xb].event_error);
      memcpy(pvVar4,__s,(long)pcVar3 - (long)__s);
    }
    sVar2 = strlen((char *)__s_01);
    if (sVar2 == 0) {
      nn_chunkref_init((nn_chunkref *)self_01,(size_t)size);
      pcVar3 = (char *)nn_chunkref_data((nn_chunkref *)&tran[0xb].event_sent.srcptr);
      strncpy(pcVar3,"/",2);
    }
    else {
      nn_chunkref_init((nn_chunkref *)self_01,(size_t)size);
      pcVar3 = (char *)nn_chunkref_data((nn_chunkref *)&tran[0xb].event_sent.srcptr);
      strncpy(pcVar3,(char *)__s_01,sVar2 + 1);
    }
    self_00 = tran;
    nn_ep_getctx((nn_ep *)0x155b97);
    nn_fsm_init_root(&pnVar6->fsm,(nn_fsm_fn)fn,(nn_fsm_fn)self_00,
                     (nn_ctx *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    tran->state = 1;
    nn_usock_init(self_00,in_stack_fffffffffffffebc,(nn_fsm *)0x155bd6);
    lVar7 = 4;
    nn_ep_getopt(self_01,(int)((ulong)size >> 0x20),(int)size,pnVar6,(size_t *)fn);
    if (lVar7 != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (msg_type)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
              ,0xf3);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined1 *)&tran[1].task_accept.item.next = local_10c;
    lVar7 = 4;
    nn_ep_getopt(self_01,(int)((ulong)size >> 0x20),(int)size,pnVar6,(size_t *)fn);
    if (lVar7 != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
              ,0xf8);
      fflush(_stderr);
      nn_err_abort();
    }
    lVar7 = 4;
    nn_ep_getopt(self_01,(int)((ulong)size >> 0x20),(int)size,pnVar6,(size_t *)fn);
    if (lVar7 != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (reconnect_ivl_max)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
              ,0xfc);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_backoff_init((nn_backoff *)pnVar6,(int)((ulong)fn >> 0x20),(int)fn,
                    (int)((ulong)self_00 >> 0x20),
                    (nn_fsm *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    nn_sws_init(pnVar6,(int)((ulong)fn >> 0x20),(nn_ep *)self_00,
                (nn_fsm *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    nn_dns_init((nn_dns *)self_00,in_stack_fffffffffffffebc,(nn_fsm *)0x155dec);
    nn_fsm_start((nn_fsm *)0x155df6);
    local_4 = 0;
  }
  else {
    nn_free((void *)0x1559d0);
    local_4 = -0x13;
  }
  return local_4;
}

Assistant:

int nn_cws_create (struct nn_ep *ep)
{
    int rc;
    const char *addr;
    size_t addrlen;
    const char *semicolon;
    const char *hostname;
    size_t hostlen;
    const char *colon;
    const char *slash;
    const char *resource;
    size_t resourcelen;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    struct nn_cws *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    int msg_type;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_cws), "cws");
    alloc_assert (self);
    self->ep = ep;
    self->peer_gone = 0;

    /*  Initalise the endpoint. */
    nn_ep_tran_setup (ep, &nn_cws_ep_ops, self);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Start parsing the address. */
    addr = nn_ep_getaddr (ep);
    addrlen = strlen (addr);
    semicolon = strchr (addr, ';');
    hostname = semicolon ? semicolon + 1 : addr;
    colon = strrchr (addr, ':');
    slash = colon ? strchr (colon, '/') : strchr (addr, '/');
    resource = slash ? slash : addr + addrlen;
    self->remote_hostname_len = colon ? colon - hostname : resource - hostname;

    /*  Host contains both hostname and port. */
    hostlen = resource - hostname;

    /*  Parse the port; assume port 80 if not explicitly declared. */
    if (colon != NULL) {
        rc = nn_port_resolve (colon + 1, resource - colon - 1);
        if (rc < 0) {
            nn_free(self);
            return -EINVAL;
        }
        self->remote_port = rc;
    }
    else {
        self->remote_port = 80;
    }

    /*  Check whether the host portion of the address is either a literal
        or a valid hostname. */
    if (nn_dns_check_hostname (hostname, self->remote_hostname_len) < 0 &&
          nn_literal_resolve (hostname, self->remote_hostname_len, ipv4only,
          &ss, &sslen) < 0) {
        nn_free(self);
        return -EINVAL;
    }

    /*  If local address is specified, check whether it is valid. */
    if (semicolon) {
        rc = nn_iface_resolve (addr, semicolon - addr, ipv4only, &ss, &sslen);
        if (rc < 0) {
            nn_free(self);
            return -ENODEV;
        }
    }

    /*  At this point, the address is valid, so begin allocating resources. */
    nn_chunkref_init (&self->remote_host, hostlen + 1);
    memcpy (nn_chunkref_data (&self->remote_host), hostname, hostlen);
    ((uint8_t *) nn_chunkref_data (&self->remote_host)) [hostlen] = '\0';

    if (semicolon) {
        nn_chunkref_init (&self->nic, semicolon - addr);
        memcpy (nn_chunkref_data (&self->nic),
            addr, semicolon - addr);
    }
    else {
        nn_chunkref_init (&self->nic, 1);
        memcpy (nn_chunkref_data (&self->nic), "*", 1);
    }

    /*  The requested resource is used in opening handshake. */
    resourcelen = strlen (resource);
    if (resourcelen) {
        nn_chunkref_init (&self->resource, resourcelen + 1);
        strncpy (nn_chunkref_data (&self->resource),
            resource, resourcelen + 1);
    }
    else {
        /*  No resource specified, so allocate base path. */
        nn_chunkref_init (&self->resource, 2);
        strncpy (nn_chunkref_data (&self->resource), "/", 2);
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_cws_handler, nn_cws_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_CWS_STATE_IDLE;
    nn_usock_init (&self->usock, NN_CWS_SRC_USOCK, &self->fsm);

    sz = sizeof (msg_type);
    nn_ep_getopt (ep, NN_WS, NN_WS_MSG_TYPE, &msg_type, &sz);
    nn_assert (sz == sizeof (msg_type));
    self->msg_type = (uint8_t) msg_type;

    sz = sizeof (reconnect_ivl);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL, &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_CWS_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);

    nn_sws_init (&self->sws, NN_CWS_SRC_SWS, ep, &self->fsm);
    nn_dns_init (&self->dns, NN_CWS_SRC_DNS, &self->fsm);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    return 0;
}